

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O2

void __thiscall FS::Focuser::doCaps(Focuser *this,CommandPacket cp)

{
  NetInterface *pNVar1;
  char *string;
  
  ::operator<<((this->debugLog)._M_t.
               super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
               super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
               super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl,
               "Processing capabilities request\n");
  pNVar1 = ::operator<<((this->net)._M_t.
                        super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t
                        .super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
                        super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl,"MaxPos: ");
  pNVar1 = ::operator<<(pNVar1,(this->buildParams).maxAbsPos);
  ::operator<<(pNVar1,"\n");
  pNVar1 = ::operator<<((this->net)._M_t.
                        super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t
                        .super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
                        super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl,"CanHome: ");
  string = "NO\n";
  if ((this->buildParams).focuserHasHome != false) {
    string = "YES\n";
  }
  ::operator<<(pNVar1,string);
  return;
}

Assistant:

void Focuser::doCaps( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing capabilities request\n";
  *net << "MaxPos: " << buildParams.maxAbsPos << "\n";
  *net << "CanHome: " << (buildParams.focuserHasHome ? "YES\n" : "NO\n" );
}